

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  byte bVar2;
  params *ppVar3;
  uint64 uVar4;
  results *prVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint64 (*pauVar13) [3];
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint16 r;
  uint uVar18;
  uint uVar19;
  ushort uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  uint64 (*pauVar25) [3];
  short sVar26;
  color_quad_u8 *pcVar27;
  uint64 s;
  uint uVar28;
  uint16 g;
  uint uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  ushort uVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  uint uVar42;
  uint uVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint local_1ac;
  vector<unsigned_int> solutions;
  uint64 hist [4];
  uint64 d [3];
  undefined1 local_118 [16];
  color_quad_u8 block_colors [4];
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  
  uVar36 = (uint)(low_color->m_s[1] * 64.0);
  uVar37 = (uint)(high_color->m_s[0] * 32.0);
  uVar42 = -(uint)((int)uVar36 < 0x3f);
  uVar45 = -(uint)((int)uVar37 < 0x1f);
  uVar42 = ~uVar42 & 0x3f | uVar36 & uVar42;
  uVar36 = ~uVar45 & 0x1f | uVar37 & uVar45;
  uVar36 = -(uint)(0 < (int)uVar36) & uVar36;
  auVar40._0_4_ = (-(uint)(0 < (int)uVar42) & uVar42) << 5;
  auVar41._4_4_ = uVar36 << 5;
  auVar41._0_4_ = auVar40._0_4_;
  auVar41._8_4_ = auVar41._4_4_;
  auVar41._12_4_ = uVar36 << 0xb;
  auVar40._8_8_ = auVar41._8_8_;
  auVar40._4_4_ = uVar36 << 0xb;
  uVar36 = (uint)(low_color->m_s[0] * 32.0);
  uVar37 = (uint)(high_color->m_s[1] * 64.0);
  uVar42 = -(uint)((int)uVar36 < 0x1f);
  uVar45 = -(uint)((int)uVar37 < 0x3f);
  uVar42 = ~uVar42 & 0x1f | uVar36 & uVar42;
  uVar36 = ~uVar45 & 0x3f | uVar37 & uVar45;
  uVar36 = -(uint)(0 < (int)uVar36) & uVar36;
  auVar38._0_4_ = (-(uint)(0 < (int)uVar42) & uVar42) << 0xb;
  auVar39._4_4_ = uVar36 << 0xb;
  auVar39._0_4_ = auVar38._0_4_;
  auVar39._8_4_ = auVar39._4_4_;
  auVar39._12_4_ = uVar36 << 5;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._4_4_ = uVar36 << 5;
  auVar44._0_4_ = (int)(low_color->m_s[2] * 32.0);
  auVar44._4_4_ = (int)(high_color->m_s[2] * 32.0);
  auVar44._8_8_ = 0;
  auVar43._0_4_ = -(uint)(auVar44._0_4_ < (int)DAT_0018cf20);
  auVar43._4_4_ = -(uint)(auVar44._4_4_ < DAT_0018cf20._4_4_);
  auVar43._8_4_ = -(uint)(0 < DAT_0018cf20._8_4_);
  auVar43._12_4_ = -(uint)(0 < DAT_0018cf20._12_4_);
  auVar44 = ~auVar43 & _DAT_0018cf20 | auVar44 & auVar43;
  auVar35._0_4_ = -(uint)(0 < auVar44._0_4_);
  auVar35._4_4_ = -(uint)(0 < auVar44._4_4_);
  auVar35._8_4_ = -(uint)(0 < auVar44._8_4_);
  auVar35._12_4_ = -(uint)(0 < auVar44._12_4_);
  auVar44 = auVar35 & auVar44 | auVar38 | auVar40;
  hist[2] = 0;
  hist[3] = 0;
  hist[0] = 0;
  hist[1] = 0;
  D2[3][1] = 0;
  D2[3][2] = 0;
  D2[2][2] = 0;
  D2[3][0] = 0;
  D2[2][0] = 0;
  D2[2][1] = 0;
  D2[1][1] = 0;
  D2[1][2] = 0;
  D2[0][2] = 0;
  D2[1][0] = 0;
  D2[0][0] = 0;
  D2[0][1] = 0;
  DD[3][1] = 0;
  DD[3][2] = 0;
  DD[2][2] = 0;
  DD[3][0] = 0;
  DD[2][0] = 0;
  DD[2][1] = 0;
  DD[1][1] = 0;
  DD[1][2] = 0;
  DD[0][2] = 0;
  DD[1][0] = 0;
  DD[0][0] = 0;
  DD[0][1] = 0;
  ppVar3 = this->m_pParams;
  uVar36 = ppVar3->m_num_pixels;
  lVar12 = 0;
  for (uVar24 = 0; uVar24 != uVar36; uVar24 = uVar24 + 1) {
    bVar1 = ppVar3->m_pSelectors[uVar24];
    pcVar27 = ppVar3->m_pPixels;
    hist[bVar1] = hist[bVar1] + 1;
    for (lVar30 = 0; lVar30 != 3; lVar30 = lVar30 + 1) {
      bVar2 = (pcVar27->field_0).c[lVar30 + lVar12];
      D2[bVar1][lVar30] = D2[bVar1][lVar30] + (ulong)((uint)bVar2 * 2);
      DD[bVar1][lVar30] = DD[bVar1][lVar30] + (ulong)bVar2 * (ulong)bVar2;
    }
    lVar12 = lVar12 + 4;
  }
  local_118 = pshuflw(auVar44,auVar44,0xe8);
  vector<unsigned_int>::vector(&solutions,0x36);
  uVar24 = hist[2] + hist[0];
  uVar10 = hist[3] + hist[1];
  bVar9 = true;
  iVar7 = 8;
  while( true ) {
    bVar34 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if ((!bVar9) || (bVar34)) break;
    uVar42 = local_118._0_4_;
    uVar45 = uVar42 >> 5 & 0x3f;
    uVar37 = uVar42 & 0xffff;
    uVar11 = 0;
    sVar26 = (short)(uVar42 & 0x1f);
    uVar36 = (uint)(ushort)(sVar26 - 1);
    if (sVar26 == 0) {
      uVar36 = 0;
    }
    sVar26 = (short)uVar45;
    uVar31 = (uint)(ushort)(sVar26 - 1);
    if (sVar26 == 0) {
      uVar31 = 0;
    }
    uVar33 = local_118._2_2_;
    uVar21 = (uint)(ushort)((short)(uVar37 >> 0xb) + -1 + (ushort)(local_118._0_2_ < 0x800));
    local_1ac = uVar21 << 0xb | uVar36 | uVar31 << 5;
    iVar22 = uVar37 - local_1ac;
    uVar14 = (uint)uVar33 * 0x10000 + local_1ac;
    for (; (uVar36 <= (uVar42 & 0x1f) + 1 &&
           (iVar23 = iVar22, uVar15 = uVar14, uVar28 = local_1ac, uVar29 = uVar31, uVar36 < 0x20));
        uVar36 = uVar36 + 1) {
      for (; (uVar29 <= uVar45 + 1 &&
             (uVar16 = uVar15, uVar18 = uVar21, uVar19 = uVar28, iVar17 = iVar23, uVar29 < 0x40));
          uVar29 = uVar29 + 1) {
        for (; (uVar18 <= (uVar37 >> 0xb) + 1 && (uVar18 < 0x20)); uVar18 = uVar18 + 1) {
          uVar32 = uVar11;
          if (iVar17 != 0) {
            uVar6 = uVar16 << 0x10 | uVar16 >> 0x10;
            if (uVar33 <= uVar19 && uVar19 != uVar33) {
              uVar6 = uVar16;
            }
            uVar32 = (ulong)((int)uVar11 + 1);
            solutions.m_p[uVar11] = uVar6;
          }
          uVar11 = uVar32;
          uVar16 = uVar16 + 0x800;
          uVar19 = uVar19 + 0x800;
          iVar17 = iVar17 + -0x800;
        }
        iVar23 = iVar23 + -0x20;
        uVar15 = uVar15 + 0x20;
        uVar28 = uVar28 + 0x20;
      }
      local_1ac = local_1ac + 1;
      iVar22 = iVar22 + -1;
      uVar14 = uVar14 + 1;
    }
    uVar36 = uVar33 & 0x1f;
    uVar42 = uVar33 >> 5 & 0x3f;
    sVar26 = (short)uVar36;
    uVar45 = (uint)(ushort)(sVar26 - 1);
    if (sVar26 == 0) {
      uVar45 = 0;
    }
    sVar26 = (short)uVar42;
    uVar31 = (uint)(ushort)(sVar26 - 1);
    if (sVar26 == 0) {
      uVar31 = 0;
    }
    uVar20 = ((uVar33 >> 0xb) - 1) + (ushort)(uVar33 < 0x800);
    local_1ac = (uint)uVar20 << 0xb | uVar45 | uVar31 << 5;
    iVar22 = uVar33 - local_1ac;
    uVar14 = uVar37 * 0x10000 + local_1ac;
    for (; (uVar45 <= uVar36 + 1 &&
           (uVar15 = local_1ac, uVar28 = uVar31, uVar21 = uVar14, iVar23 = iVar22, uVar45 < 0x20));
        uVar45 = uVar45 + 1) {
      for (; (uVar28 <= uVar42 + 1 &&
             (uVar19 = (uint)uVar20, uVar29 = uVar15, iVar17 = iVar23, uVar16 = uVar21,
             uVar28 < 0x40)); uVar28 = uVar28 + 1) {
        for (; (uVar19 <= (uVar33 >> 0xb) + 1 && (uVar19 < 0x20)); uVar19 = uVar19 + 1) {
          uVar32 = uVar11;
          if (iVar17 != 0) {
            uVar18 = uVar16 << 0x10 | uVar16 >> 0x10;
            if (uVar37 < uVar29) {
              uVar18 = uVar16;
            }
            uVar32 = (ulong)((int)uVar11 + 1);
            solutions.m_p[uVar11] = uVar18;
          }
          uVar11 = uVar32;
          uVar29 = uVar29 + 0x800;
          iVar17 = iVar17 + -0x800;
          uVar16 = uVar16 + 0x800;
        }
        uVar15 = uVar15 + 0x20;
        uVar21 = uVar21 + 0x20;
        iVar23 = iVar23 + -0x20;
      }
      local_1ac = local_1ac + 1;
      iVar22 = iVar22 + -1;
      uVar14 = uVar14 + 1;
    }
    std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (solutions.m_p,solutions.m_p + uVar11);
    bVar9 = false;
    for (uVar32 = 0; pcVar27 = block_colors, uVar32 != uVar11; uVar32 = uVar32 + 1) {
      if (uVar32 == 0) {
        uVar36 = *solutions.m_p;
LAB_00181c3f:
        uVar33 = (ushort)(uVar36 >> 0x10);
        if ((uVar36 & 0xffff) == uVar36 >> 0x10) {
          if (uVar10 < uVar24) {
            uVar37 = (uint)((short)uVar36 == 0);
            if ((uVar36 & 0x1f0000) == 0) {
              sVar26 = -0x800;
              if (uVar36 < 0x8000000) {
                sVar26 = (ushort)(uVar36 < 0x10000) * 0x20 + -0x20;
              }
            }
            else {
              sVar26 = -1;
            }
          }
          else {
            uVar42 = ~uVar36;
            uVar37 = 1;
            if (((uVar42 & 0x1f) == 0) && (uVar37 = 0x800, (uVar42 & 0xf800) == 0)) {
              uVar37 = (uint)((uVar42 & 0x7e0) != 0) << 5;
            }
            sVar26 = -(ushort)(uVar36 >> 0x10 == 0xffff);
          }
          uVar36 = uVar37 + uVar36;
          uVar33 = uVar33 + sVar26;
        }
        dxt1_block::get_block_colors4(pcVar27,(uint16)uVar36,uVar33);
        bVar34 = this->m_pParams->m_perceptual;
        pauVar13 = D2;
        pauVar25 = DD;
        uVar8 = 0;
        for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
          uVar4 = hist[lVar12];
          for (lVar30 = 0; lVar30 != 3; lVar30 = lVar30 + 1) {
            d[lVar30] = (uVar4 * (pcVar27->field_0).c[lVar30] - (*pauVar13)[lVar30]) *
                        (ulong)(pcVar27->field_0).c[lVar30] + (*pauVar25)[lVar30];
          }
          if (bVar34 == false) {
            lVar30 = d[0] + d[1];
          }
          else {
            lVar30 = d[1] * 0x19 + d[0] * 8;
          }
          uVar8 = uVar8 + lVar30 + d[2];
          pcVar27 = pcVar27 + 1;
          pauVar25 = pauVar25 + 1;
          pauVar13 = pauVar13 + 1;
        }
        prVar5 = this->m_pResults;
        if (uVar8 < prVar5->m_error) {
          prVar5->m_low_color = (uint16)uVar36;
          prVar5->m_high_color = uVar33;
          prVar5->m_error = uVar8;
          if (uVar8 == 0) goto LAB_00181deb;
          local_118._8_8_ = 0;
          local_118._0_8_ = (ulong)uVar36 & 0xffffffff0000ffff | (ulong)uVar33 << 0x10;
          bVar9 = true;
        }
      }
      else {
        uVar36 = solutions.m_p[uVar32];
        if (uVar36 != solutions.m_p[uVar32 - 1]) goto LAB_00181c3f;
      }
    }
  }
LAB_00181deb:
  vector<unsigned_int>::~vector(&solutions);
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color)
    {
        uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
        uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

        uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            const color_quad_u8& pixel = m_pParams->m_pPixels[i];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            for (uint c = 0; c < 3; c++)
            {
                D2[s][c] += pixel[c] * 2;
                DD[s][c] += pixel[c] * pixel[c];
            }
        }
        crnlib::vector<uint> solutions(54);
        bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
        bool improved = true;

        for (uint iterations = 8; improved && iterations; iterations--)
        {
            improved = false;
            uint solutions_count = 0;
            for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 L = r << 11 | g << 5 | b;
                        if (L != L0)
                        {
                            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
                        }
                    }
                }
            }
            for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++)
            {
                for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++)
                {
                    for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++)
                    {
                        uint16 H = r << 11 | g << 5 | b;
                        if (H != H0)
                        {
                            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
                        }
                    }
                }
            }
            std::sort(solutions.begin(), solutions.begin() + solutions_count);
            for (uint i = 0; i < solutions_count; i++)
            {
                if (i && solutions[i] == solutions[i - 1])
                {
                    continue;
                }
                uint16 L = solutions[i] & 0xFFFF;
                uint16 H = solutions[i] >> 16;
                if (L == H)
                {
                    L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800
                            : ~L & 0x7E0                            ? 0x20
                                                                    : 0
                        : !L        ? 0x1
                                    : 0;
                    H -= preserveL    ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800
                               : H & 0x7E0                          ? 0x20
                                                                    : 0
                        : H == 0xFFFF ? 0x1
                                      : 0;
                }
                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors4(block_colors, L, H);
                uint64 error = 0;
                for (uint64 s = 0, d[3]; s < 4; s++)
                {
                    for (uint c = 0; c < 3; c++)
                    {
                        d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
                    }
                    error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
                }
                if (error < m_pResults->m_error)
                {
                    m_pResults->m_low_color = L0 = L;
                    m_pResults->m_high_color = H0 = H;
                    m_pResults->m_error = error;
                    if (!m_pResults->m_error)
                    {
                        return;
                    }
                    improved = true;
                }
            }
        }
    }